

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

void __thiscall OpenMD::Stats::parseStatFileFormat(Stats *this,string *format)

{
  undefined1 uVar1;
  bool bVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  iterator i;
  string token;
  StringTokenizer tokenizer;
  errorStruct *in_stack_fffffffffffffee8;
  StringTokenizer *in_stack_fffffffffffffef0;
  iterator in_stack_fffffffffffffef8;
  locale *this_00;
  undefined7 in_stack_ffffffffffffff08;
  string *delim;
  _Self in_stack_ffffffffffffff28;
  _Self in_stack_ffffffffffffff30;
  locale local_c8 [8];
  string local_c0 [55];
  undefined1 local_89 [33];
  StringTokenizer *in_stack_ffffffffffffff98;
  
  delim = (string *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff30._M_node,(char *)in_stack_ffffffffffffff28._M_node,
             (allocator<char> *)delim);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_ffffffffffffff30._M_node,
             (string *)in_stack_ffffffffffffff28._M_node,delim);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  while( true ) {
    uVar1 = StringTokenizer::hasMoreTokens((StringTokenizer *)in_stack_fffffffffffffef8._M_node);
    if (!(bool)uVar1) break;
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff98);
    this_00 = local_c8;
    std::locale::locale(this_00);
    toUpper<std::__cxx11::string>(in_RDI,(locale *)CONCAT17(uVar1,in_stack_ffffffffffffff08));
    std::locale::~locale(local_c8);
    in_stack_fffffffffffffef8 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
                 *)in_stack_fffffffffffffee8,(key_type *)0x2f5525);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
           *)in_stack_fffffffffffffee8);
    bVar2 = std::operator!=((_Self *)&stack0xffffffffffffff30,(_Self *)&stack0xffffffffffffff28);
    if (bVar2) {
      in_stack_fffffffffffffef0 = (StringTokenizer *)&in_RDI[1].field_2;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>
                    *)0x2f5579);
      std::bitset<46UL>::set
                ((bitset<46UL> *)this_00,(size_t)in_stack_fffffffffffffef8._M_node,
                 SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0));
    }
    else {
      uVar3 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffee8 = &painCave;
      snprintf(painCave.errMsg,2000,
               "Stats::parseStatFileFormat: %s is not a recognized\n\tstatFileFormat keyword.\n",
               uVar3);
      in_stack_fffffffffffffee8->isFatal = 0;
      in_stack_fffffffffffffee8->severity = 1;
      simError();
    }
    std::__cxx11::string::~string(local_c0);
  }
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void Stats::parseStatFileFormat(const std::string& format) {
    StringTokenizer tokenizer(format, " ,;|\t\n\r");

    while (tokenizer.hasMoreTokens()) {
      std::string token(tokenizer.nextToken());
      toUpper(token);
      StatsMapType::iterator i = statsMap_.find(token);
      if (i != statsMap_.end()) {
        statsMask_.set(i->second);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Stats::parseStatFileFormat: %s is not a recognized\n"
                 "\tstatFileFormat keyword.\n",
                 token.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_ERROR;
        simError();
      }
    }
  }